

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headers.c
# Opt level: O2

CURLcode Curl_headers_push(Curl_easy *data,char *header,uchar type)

{
  char cVar1;
  char *pcVar2;
  size_t sVar3;
  Curl_header_store *pCVar4;
  char *pcVar5;
  char *pcVar6;
  uchar *puVar7;
  char cVar8;
  ulong __n;
  ulong __n_00;
  long lVar9;
  Curl_header_store *hs;
  long lVar10;
  
  cVar8 = *header;
  if (cVar8 == '\n') {
    return CURLE_OK;
  }
  if (cVar8 == '\r') {
    return CURLE_OK;
  }
  pcVar2 = strchr(header,0xd);
  if ((pcVar2 == (char *)0x0) && (pcVar2 = strchr(header,10), pcVar2 == (char *)0x0)) {
    return CURLE_WEIRD_SERVER_REPLY;
  }
  __n_00 = (long)pcVar2 - (long)header;
  if ((cVar8 == ' ') || (cVar8 == '\t')) {
    pCVar4 = (data->state).prevhead;
    if (pCVar4 != (Curl_header_store *)0x0) {
      pcVar2 = pCVar4->value;
      sVar3 = strlen(pcVar2);
      lVar10 = (long)pcVar2 - (long)pCVar4;
      do {
        __n = __n_00;
        __n_00 = __n - 1;
        if (__n == 0) break;
        cVar1 = header[__n - 1];
      } while (((cVar1 == '\t') || (cVar1 == ' ')) || ((byte)(cVar1 - 10U) < 4));
      lVar9 = sVar3 + __n;
      for (pcVar2 = header + 1;
          ((1 < __n && ((cVar8 == ' ' || (cVar8 == '\t')))) &&
          ((cVar8 = *pcVar2, cVar8 == ' ' || (cVar8 == '\t')))); pcVar2 = pcVar2 + 1) {
        __n = __n - 1;
        lVar9 = lVar9 + -1;
      }
      Curl_node_remove(&pCVar4->node);
      pCVar4 = (Curl_header_store *)Curl_saferealloc(pCVar4,lVar10 + lVar9 + 5);
      if (pCVar4 == (Curl_header_store *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      pCVar4->name = pCVar4->buffer;
      pcVar5 = (char *)(lVar10 + (long)pCVar4);
      pCVar4->value = pcVar5;
      memcpy(pcVar5 + sVar3,pcVar2 + -1,__n);
      pCVar4->value[lVar9] = '\0';
      Curl_llist_append(&(data->state).httphdrs,pCVar4,(Curl_llist_node *)pCVar4);
      (data->state).prevhead = pCVar4;
      return CURLE_OK;
    }
    while( true ) {
      if (__n_00 == 0) {
        return CURLE_WEIRD_SERVER_REPLY;
      }
      if ((*header != ' ') && (*header != '\t')) break;
      header = header + 1;
      __n_00 = __n_00 - 1;
    }
  }
  pCVar4 = (Curl_header_store *)(*Curl_ccalloc)(1,__n_00 + 0x38);
  if (pCVar4 == (Curl_header_store *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  pcVar2 = pCVar4->buffer;
  memcpy(pcVar2,header,__n_00);
  pCVar4->buffer[__n_00] = '\0';
  pcVar5 = pcVar2;
  if (type == '\x10') {
    if (*pcVar2 != ':') goto LAB_0012da2b;
    pcVar5 = &pCVar4->field_0x36;
  }
  while( true ) {
    pcVar6 = pcVar5;
    pcVar5 = pcVar6 + 1;
    if (*pcVar6 == '\0') break;
    if (*pcVar6 == ':') {
      *pcVar6 = '\0';
      for (; (*pcVar5 == '\t' || (*pcVar5 == ' ')); pcVar5 = pcVar5 + 1) {
      }
      for (puVar7 = (uchar *)(pCVar4->buffer + (__n_00 - 1));
          (pcVar5 < puVar7 &&
          (((cVar8 = *puVar7, cVar8 == '\t' || (cVar8 == ' ')) || ((byte)(cVar8 - 10U) < 4))));
          puVar7 = puVar7 + -1) {
        *puVar7 = '\0';
      }
      pCVar4->name = pcVar2;
      pCVar4->value = pcVar5;
      pCVar4->type = type;
      pCVar4->request = (data->state).requests;
      Curl_llist_append(&(data->state).httphdrs,pCVar4,(Curl_llist_node *)pCVar4);
      (data->state).prevhead = pCVar4;
      return CURLE_OK;
    }
  }
LAB_0012da2b:
  (*Curl_cfree)(pCVar4);
  return CURLE_BAD_FUNCTION_ARGUMENT;
}

Assistant:

CURLcode Curl_headers_push(struct Curl_easy *data, const char *header,
                           unsigned char type)
{
  char *value = NULL;
  char *name = NULL;
  char *end;
  size_t hlen; /* length of the incoming header */
  struct Curl_header_store *hs;
  CURLcode result = CURLE_OUT_OF_MEMORY;

  if((header[0] == '\r') || (header[0] == '\n'))
    /* ignore the body separator */
    return CURLE_OK;

  end = strchr(header, '\r');
  if(!end) {
    end = strchr(header, '\n');
    if(!end)
      /* neither CR nor LF as terminator is not a valid header */
      return CURLE_WEIRD_SERVER_REPLY;
  }
  hlen = end - header;

  if((header[0] == ' ') || (header[0] == '\t')) {
    if(data->state.prevhead)
      /* line folding, append value to the previous header's value */
      return unfold_value(data, header, hlen);
    else {
      /* cannot unfold without a previous header. Instead of erroring, just
         pass the leading blanks. */
      while(hlen && ISBLANK(*header)) {
        header++;
        hlen--;
      }
      if(!hlen)
        return CURLE_WEIRD_SERVER_REPLY;
    }
  }

  hs = calloc(1, sizeof(*hs) + hlen);
  if(!hs)
    return CURLE_OUT_OF_MEMORY;
  memcpy(hs->buffer, header, hlen);
  hs->buffer[hlen] = 0; /* nul terminate */

  result = namevalue(hs->buffer, hlen, type, &name, &value);
  if(!result) {
    hs->name = name;
    hs->value = value;
    hs->type = type;
    hs->request = data->state.requests;

    /* insert this node into the list of headers */
    Curl_llist_append(&data->state.httphdrs, hs, &hs->node);
    data->state.prevhead = hs;
  }
  else
    free(hs);
  return result;
}